

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O2

FT_Error tt_sbit_decoder_load_bit_aligned
                   (TT_SBitDecoder decoder,FT_Byte *p,FT_Byte *limit,FT_Int x_pos,FT_Int y_pos,
                   FT_UInt recurse_count)

{
  ushort uVar1;
  int iVar2;
  FT_Bitmap *pFVar3;
  uint uVar4;
  FT_Error FVar5;
  FT_Error FVar6;
  byte bVar7;
  uint uVar8;
  long lVar9;
  byte *pbVar10;
  uint uVar11;
  byte *pbVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  byte *pbVar16;
  uint uVar17;
  
  FVar5 = 3;
  FVar6 = 3;
  if ((-1 < x_pos) && (-1 < y_pos)) {
    pFVar3 = decoder->bitmap;
    uVar8 = (uint)decoder->metrics->width;
    FVar6 = FVar5;
    if ((uVar8 + x_pos <= pFVar3->width) &&
       (uVar1 = decoder->metrics->height, (uint)uVar1 + y_pos <= pFVar3->rows)) {
      uVar8 = decoder->bit_depth * uVar8;
      uVar11 = (uint)uVar1;
      if ((p + (uVar8 * uVar11 + 7 >> 3) <= limit) && (FVar6 = 0, uVar1 != 0 && uVar8 != 0)) {
        iVar2 = pFVar3->pitch;
        pbVar16 = pFVar3->buffer + (int)(((uint)x_pos >> 3) + y_pos * iVar2);
        uVar15 = x_pos & 7;
        uVar4 = 8 - uVar15;
        if (uVar8 < 8 - uVar15) {
          uVar4 = uVar8;
        }
        uVar13 = 0;
        uVar17 = 0;
        for (; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
          pbVar10 = p;
          pbVar12 = pbVar16;
          uVar14 = uVar8;
          if (uVar15 != 0) {
            if (uVar11 == uVar1) {
              uVar17 = (uint)*p;
              p = p + 1;
              uVar13 = uVar15;
            }
            else if ((int)uVar13 < (int)uVar4) {
              if (p < limit) {
                bVar7 = *p;
                p = p + 1;
                uVar17 = uVar17 | bVar7;
              }
              uVar13 = (uVar13 - uVar4) + 8;
            }
            else {
              uVar17 = (uVar17 & 0xffff) >> 8;
              uVar13 = uVar13 - uVar4;
            }
            *pbVar16 = *pbVar16 |
                       (byte)((uVar17 & 0xffff) >> ((byte)uVar13 & 0x1f)) &
                       (byte)(~(0xff << ((byte)uVar4 & 0x1f)) <<
                             (8 - ((char)uVar15 + (byte)uVar4) & 0x1f));
            uVar17 = uVar17 << 8;
            pbVar10 = p;
            pbVar12 = pbVar16 + 1;
            uVar14 = uVar8 - uVar4;
          }
          lVar9 = 0;
          while( true ) {
            bVar7 = (byte)uVar13;
            if ((int)uVar14 < 8) break;
            uVar17 = uVar17 & 0xffff | (uint)pbVar10[lVar9];
            pbVar12[lVar9] = pbVar12[lVar9] | (byte)(uVar17 >> (bVar7 & 0x1f));
            uVar17 = uVar17 << 8;
            uVar14 = uVar14 - 8;
            lVar9 = lVar9 + 1;
          }
          p = pbVar10 + lVar9;
          if (0 < (int)uVar14) {
            if ((int)uVar13 < (int)uVar14) {
              if (p < limit) {
                p = pbVar10 + lVar9 + 1;
                uVar17 = uVar17 | pbVar10[lVar9];
              }
              pbVar12[lVar9] =
                   pbVar12[lVar9] |
                   (byte)(0xff00 >> ((byte)uVar14 & 0x1f)) &
                   (byte)((uVar17 & 0xffff) >> (bVar7 & 0x1f));
              uVar13 = (uVar13 - uVar14) + 8;
              uVar17 = uVar17 << 8;
            }
            else {
              pbVar12[lVar9] =
                   pbVar12[lVar9] |
                   (byte)(0xff00 >> ((byte)uVar14 & 0x1f)) &
                   (byte)((uVar17 & 0xffff) >> (bVar7 & 0x1f));
              uVar13 = uVar13 - uVar14;
            }
          }
          pbVar16 = pbVar16 + iVar2;
        }
        FVar6 = 0;
      }
    }
  }
  return FVar6;
}

Assistant:

static FT_Error
  tt_sbit_decoder_load_bit_aligned( TT_SBitDecoder  decoder,
                                    FT_Byte*        p,
                                    FT_Byte*        limit,
                                    FT_Int          x_pos,
                                    FT_Int          y_pos,
                                    FT_UInt         recurse_count )
  {
    FT_Error    error = FT_Err_Ok;
    FT_Byte*    line;
    FT_Int      pitch, width, height, line_bits, h, nbits;
    FT_UInt     bit_height, bit_width;
    FT_Bitmap*  bitmap;
    FT_UShort   rval;

    FT_UNUSED( recurse_count );


    /* check that we can write the glyph into the bitmap */
    bitmap     = decoder->bitmap;
    bit_width  = bitmap->width;
    bit_height = bitmap->rows;
    pitch      = bitmap->pitch;
    line       = bitmap->buffer;

    width  = decoder->metrics->width;
    height = decoder->metrics->height;

    line_bits = width * decoder->bit_depth;

    if ( x_pos < 0 || (FT_UInt)( x_pos + width ) > bit_width   ||
         y_pos < 0 || (FT_UInt)( y_pos + height ) > bit_height )
    {
      FT_TRACE1(( "tt_sbit_decoder_load_bit_aligned:"
                  " invalid bitmap dimensions\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    if ( p + ( ( line_bits * height + 7 ) >> 3 ) > limit )
    {
      FT_TRACE1(( "tt_sbit_decoder_load_bit_aligned: broken bitmap\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    if ( !line_bits || !height )
    {
      /* nothing to do */
      goto Exit;
    }

    /* now do the blit */

    /* adjust `line' to point to the first byte of the bitmap */
    line  += y_pos * pitch + ( x_pos >> 3 );
    x_pos &= 7;

    /* the higher byte of `rval' is used as a buffer */
    rval  = 0;
    nbits = 0;

    for ( h = height; h > 0; h--, line += pitch )
    {
      FT_Byte*  pwrite = line;
      FT_Int    w      = line_bits;


      /* handle initial byte (in target bitmap) specially if necessary */
      if ( x_pos )
      {
        w = ( line_bits < 8 - x_pos ) ? line_bits : 8 - x_pos;

        if ( h == height )
        {
          rval  = *p++;
          nbits = x_pos;
        }
        else if ( nbits < w )
        {
          if ( p < limit )
            rval |= *p++;
          nbits += 8 - w;
        }
        else
        {
          rval  >>= 8;
          nbits  -= w;
        }

        *pwrite++ |= ( ( rval >> nbits ) & 0xFF ) &
                     ( ~( 0xFFU << w ) << ( 8 - w - x_pos ) );
        rval     <<= 8;

        w = line_bits - w;
      }

      /* handle medial bytes */
      for ( ; w >= 8; w -= 8 )
      {
        rval      |= *p++;
        *pwrite++ |= ( rval >> nbits ) & 0xFF;

        rval <<= 8;
      }

      /* handle final byte if necessary */
      if ( w > 0 )
      {
        if ( nbits < w )
        {
          if ( p < limit )
            rval |= *p++;
          *pwrite |= ( ( rval >> nbits ) & 0xFF ) & ( 0xFF00U >> w );
          nbits   += 8 - w;

          rval <<= 8;
        }
        else
        {
          *pwrite |= ( ( rval >> nbits ) & 0xFF ) & ( 0xFF00U >> w );
          nbits   -= w;
        }
      }
    }

  Exit:
    if ( !error )
      FT_TRACE3(( "tt_sbit_decoder_load_bit_aligned: loaded\n" ));
    return error;
  }